

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O3

void __thiscall
google::protobuf::io::IstreamInputStream::IstreamInputStream
          (IstreamInputStream *this,istream *input,int block_size)

{
  (this->super_ZeroCopyInputStream)._vptr_ZeroCopyInputStream =
       (_func_int **)&PTR__IstreamInputStream_004d4230;
  CopyingIstreamInputStream::CopyingIstreamInputStream(&this->copying_input_,input);
  CopyingInputStreamAdaptor::CopyingInputStreamAdaptor
            (&this->impl_,&(this->copying_input_).super_CopyingInputStream,block_size);
  return;
}

Assistant:

IstreamInputStream::IstreamInputStream(std::istream* input, int block_size)
    : copying_input_(input), impl_(&copying_input_, block_size) {}